

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fold.cpp
# Opt level: O3

uint32_t __thiscall
spvtools::opt::InstructionFolder::OperateWords
          (InstructionFolder *this,Op opcode,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *operand_words)

{
  uint32_t *puVar1;
  pointer puVar2;
  uint32_t uVar3;
  long lVar4;
  
  puVar1 = (operand_words->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (operand_words->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  lVar4 = (long)puVar2 - (long)puVar1 >> 2;
  if (lVar4 == 3) {
    if (opcode == OpSelect) {
      return puVar1[(ulong)(*puVar1 == 0) + 1];
    }
    __assert_fail("false && \"Unsupported ternary operation for OpSpecConstantOp instruction\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/fold.cpp"
                  ,0x9f,
                  "uint32_t spvtools::opt::InstructionFolder::TernaryOperate(spv::Op, uint32_t, uint32_t, uint32_t) const"
                 );
  }
  if (lVar4 != 2) {
    if (lVar4 == 1) {
      uVar3 = UnaryOperate(this,opcode,*puVar1);
      return uVar3;
    }
    __assert_fail("false && \"Invalid number of operands\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/fold.cpp"
                  ,0xaf,
                  "uint32_t spvtools::opt::InstructionFolder::OperateWords(spv::Op, const std::vector<uint32_t> &) const"
                 );
  }
  uVar3 = BinaryOperate(this,opcode,*puVar1,puVar2[-1]);
  return uVar3;
}

Assistant:

uint32_t InstructionFolder::OperateWords(
    spv::Op opcode, const std::vector<uint32_t>& operand_words) const {
  switch (operand_words.size()) {
    case 1:
      return UnaryOperate(opcode, operand_words.front());
    case 2:
      return BinaryOperate(opcode, operand_words.front(), operand_words.back());
    case 3:
      return TernaryOperate(opcode, operand_words[0], operand_words[1],
                            operand_words[2]);
    default:
      assert(false && "Invalid number of operands");
      return 0;
  }
}